

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateNewReflectiveServiceMethod
          (ImmutableServiceGenerator *this,Printer *printer)

{
  ServiceDescriptor *pSVar1;
  MethodDescriptor *method;
  java *method_00;
  long lVar2;
  long lVar3;
  string local_50;
  
  io::Printer::Print(printer,
                     "public static com.google.protobuf.Service newReflectiveService(\n    final Interface impl) {\n  return new $classname$() {\n"
                     ,"classname",*(string **)(this->super_ServiceGenerator).descriptor_);
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  lVar2 = 0;
  for (lVar3 = 0; pSVar1 = (this->super_ServiceGenerator).descriptor_,
      lVar3 < *(int *)(pSVar1 + 0x20); lVar3 = lVar3 + 1) {
    method_00 = (java *)(*(long *)(pSVar1 + 0x28) + lVar2);
    io::Printer::Print(printer,"@java.lang.Override\n");
    GenerateMethodSignature(this,printer,(MethodDescriptor *)method_00,IS_CONCRETE);
    UnderscoresToCamelCase_abi_cxx11_(&local_50,method_00,method);
    io::Printer::Print(printer," {\n  impl.$method$(controller, request, done);\n}\n\n","method",
                       &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = lVar2 + 0x68;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"};\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateNewReflectiveServiceMethod(
    io::Printer* printer) {
  printer->Print(
    "public static com.google.protobuf.Service newReflectiveService(\n"
    "    final Interface impl) {\n"
    "  return new $classname$() {\n",
    "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    printer->Print("@java.lang.Override\n");
    GenerateMethodSignature(printer, method, IS_CONCRETE);
    printer->Print(
      " {\n"
      "  impl.$method$(controller, request, done);\n"
      "}\n\n",
      "method", UnderscoresToCamelCase(method));
  }

  printer->Outdent();
  printer->Print("};\n");
  printer->Outdent();
  printer->Print("}\n\n");
}